

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O3

void __thiscall Movegen::pawn_caps(Movegen *this,U64 *left,U64 *right,U64 *ep_left,U64 *ep_right)

{
  ulong uVar1;
  ulong uVar2;
  code *pcVar3;
  code *pcVar4;
  
  if (this->pawns != 0) {
    uVar2 = (ulong)this->us;
    *left = this->pawns & (&bitboards::pawnmaskleft)[uVar2];
    uVar1 = (&bitboards::pawnmaskright)[uVar2] & this->pawns;
    *right = uVar1;
    pcVar4 = anon_unknown.dwarf_96215::shift<(Dir)7>;
    if (uVar2 == 0) {
      pcVar4 = anon_unknown.dwarf_96215::shift<(Dir)4>;
    }
    pcVar3 = anon_unknown.dwarf_96215::shift<(Dir)6>;
    if (uVar2 == 0) {
      pcVar3 = anon_unknown.dwarf_96215::shift<(Dir)5>;
    }
    if (*left != 0) {
      (*pcVar3)(left);
      *left = *left & this->ctarget;
      uVar1 = *right;
    }
    if (uVar1 != 0) {
      (*pcVar4)(right);
      *right = *right & this->ctarget;
    }
    if (this->eps != no_square) {
      uVar1 = (ulong)this->us;
      *ep_left = (&bitboards::pawnmaskleft)[uVar1] & this->pawns &
                 *(ulong *)(&DAT_00141b88 + (ulong)(uVar1 == 0) * 8);
      uVar1 = (&bitboards::pawnmaskright)[uVar1] & this->pawns &
              *(ulong *)(&DAT_00141b88 + (ulong)(uVar1 == 0) * 8);
      *ep_right = uVar1;
      if (*ep_left != 0) {
        (*pcVar3)(ep_left);
        *ep_left = *ep_left & (&bitboards::squares)[this->eps];
        uVar1 = *ep_right;
      }
      if (uVar1 != 0) {
        (*pcVar4)(ep_right);
        *ep_right = *ep_right & (&bitboards::squares)[this->eps];
      }
    }
  }
  return;
}

Assistant:

inline void Movegen::pawn_caps(U64& left, U64& right, U64& ep_left, U64& ep_right) {

	if (pawns == 0ULL) return;

	// normal captures - non promotions
	left = pawns & bitboards::pawnmaskleft[us];
	right = pawns & bitboards::pawnmaskright[us];

	auto sw = (us == white ? shift<NW> : shift<SE>);
	auto se = (us == white ? shift<NE> : shift<SW>);

	if (left != 0ULL) {
		se(left);
		left &= ctarget;
	}

	if (right != 0ULL) {
		sw(right);
		right &= ctarget;
	}

	// ep captures - evasions are checked individually
	if (eps == Square::no_square) return;
	auto r = (us == white ? Row::r5 : Row::r4);
	ep_left = pawns & bitboards::pawnmaskleft[us] & bitboards::row[r];
	ep_right = pawns & bitboards::pawnmaskright[us] & bitboards::row[r];

	if (ep_left != 0ULL) {
		se(ep_left);
		ep_left &= bitboards::squares[eps];
	}

	if (ep_right != 0ULL) {
		sw(ep_right);
		ep_right &= bitboards::squares[eps];
	}
}